

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int setup_center_error_facade
              (MACROBLOCKD *xd,AV1_COMMON *cm,MV *bestmv,SUBPEL_SEARCH_VAR_PARAMS *var_params,
              MV_COST_PARAMS *mv_cost_params,uint *sse1,int *distortion,int is_scaled)

{
  AV1_COMMON *in_RCX;
  MACROBLOCKD *in_RDX;
  int *in_RDI;
  MV *in_R8;
  SUBPEL_SEARCH_VAR_PARAMS *in_R9;
  uint *in_stack_00000008;
  int *in_stack_0000c030;
  uint *in_stack_0000c038;
  MV_COST_PARAMS *in_stack_0000c040;
  SUBPEL_SEARCH_VAR_PARAMS *in_stack_0000c048;
  MV *in_stack_0000c050;
  MACROBLOCKD *in_stack_0000c058;
  MV_COST_PARAMS *in_stack_ffffffffffffffc0;
  undefined4 local_4;
  
  if ((int)sse1 == 0) {
    local_4 = setup_center_error(in_stack_0000c058,in_stack_0000c050,in_stack_0000c048,
                                 in_stack_0000c040,in_stack_0000c038,in_stack_0000c030);
  }
  else {
    local_4 = upsampled_setup_center_error
                        (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc0,in_stack_00000008,
                         in_RDI);
  }
  return local_4;
}

Assistant:

static inline int setup_center_error_facade(
    MACROBLOCKD *xd, const AV1_COMMON *cm, const MV *bestmv,
    const SUBPEL_SEARCH_VAR_PARAMS *var_params,
    const MV_COST_PARAMS *mv_cost_params, unsigned int *sse1, int *distortion,
    int is_scaled) {
  if (is_scaled) {
    return upsampled_setup_center_error(xd, cm, bestmv, var_params,
                                        mv_cost_params, sse1, distortion);
  } else {
    return setup_center_error(xd, bestmv, var_params, mv_cost_params, sse1,
                              distortion);
  }
}